

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboColorbufferTests.cpp
# Opt level: O0

Vec4 __thiscall deqp::gles3::Functional::generateRandomColor(Functional *this,Random *random)

{
  float *pfVar1;
  float fVar2;
  undefined8 in_XMM1_Qa;
  Vec4 VVar3;
  undefined4 local_1c;
  int i;
  Random *random_local;
  Vec4 *retVal;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this);
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    fVar2 = de::Random::getFloat(random);
    pfVar1 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)this,local_1c);
    *pfVar1 = fVar2;
  }
  pfVar1 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)this,3);
  *pfVar1 = 1.0;
  VVar3.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar3.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  VVar3.m_data[0] = 1.0;
  VVar3.m_data[1] = 0.0;
  return (Vec4)VVar3.m_data;
}

Assistant:

static tcu::Vec4 generateRandomColor (de::Random& random)
{
	tcu::Vec4 retVal;

	for (int i = 0; i < 3; ++i)
		retVal[i] = random.getFloat();
	retVal[3] = 1.0f;

	return retVal;
}